

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cpp
# Opt level: O1

void __thiscall testing::InSequence::InSequence(InSequence *this)

{
  Sequence *pSVar1;
  Sequence **ppSVar2;
  Sequence *pSVar3;
  Expectation *pEVar4;
  
  ppSVar2 = internal::ThreadLocal<testing::Sequence_*>::GetOrCreateValue
                      ((ThreadLocal<testing::Sequence_*> *)internal::g_gmock_implicit_sequence);
  pSVar1 = *ppSVar2;
  if (pSVar1 == (Sequence *)0x0) {
    pSVar3 = (Sequence *)operator_new(0x10);
    pEVar4 = (Expectation *)operator_new(0x10);
    (pEVar4->expectation_base_).value_ = (ExpectationBase *)0x0;
    (pEVar4->expectation_base_).link_.next_ = &(pEVar4->expectation_base_).link_;
    (pSVar3->last_expectation_).value_ = pEVar4;
    (pSVar3->last_expectation_).link_.next_ = &(pSVar3->last_expectation_).link_;
    ppSVar2 = internal::ThreadLocal<testing::Sequence_*>::GetOrCreateValue
                        ((ThreadLocal<testing::Sequence_*> *)internal::g_gmock_implicit_sequence);
    *ppSVar2 = pSVar3;
  }
  this->sequence_created_ = pSVar1 == (Sequence *)0x0;
  return;
}

Assistant:

InSequence::InSequence() {
  if (internal::g_gmock_implicit_sequence.get() == NULL) {
    internal::g_gmock_implicit_sequence.set(new Sequence);
    sequence_created_ = true;
  } else {
    sequence_created_ = false;
  }
}